

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

void __thiscall Parser::ReleaseTemporaryGuestArena(Parser *this)

{
  ScriptContext *this_00;
  TempArenaAllocatorWrapper<true> *tempGuestAllocator;
  Parser *this_local;
  
  if ((this->m_tempGuestArenaReleased & 1U) == 0) {
    SListBase<UnifiedRegex::RegexPattern_*,_Memory::ArenaAllocator,_RealCount>::Reset
              (&(this->m_registeredRegexPatterns).
                super_SListBase<UnifiedRegex::RegexPattern_*,_Memory::ArenaAllocator,_RealCount>);
    if (this->m_scriptContext != (ScriptContext *)0x0) {
      this_00 = this->m_scriptContext;
      tempGuestAllocator =
           Memory::RecyclerRootPtr::operator_cast_to_TempArenaAllocatorWrapper_
                     ((RecyclerRootPtr *)&this->m_tempGuestArena);
      Js::ScriptContext::ReleaseTemporaryGuestAllocator(this_00,tempGuestAllocator);
      Memory::AutoRecyclerRootPtr<Js::TempArenaAllocatorWrapper<true>_>::Unroot
                (&this->m_tempGuestArena);
    }
    this->m_tempGuestArenaReleased = true;
  }
  return;
}

Assistant:

void Parser::ReleaseTemporaryGuestArena()
{
    // In case of modules the Parser lives longer than the temporary Guest Arena. We may have already released the arena explicitly.
    if (!m_tempGuestArenaReleased)
    {
        // The regex patterns list has references to the temporary Guest Arena. Reset it first.
        m_registeredRegexPatterns.Reset();

        if (this->m_scriptContext != nullptr)
        {
            this->m_scriptContext->ReleaseTemporaryGuestAllocator(m_tempGuestArena);
            m_tempGuestArena.Unroot();
        }

        m_tempGuestArenaReleased = true;
    }
}